

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

bool testing::internal::
     MatchPrintAndExplain<phmap::parallel_flat_hash_set<std::unique_ptr<int,std::default_delete<int>>,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_MergeExtractInsert_Test::TestBody()::Hash,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_MergeExtractInsert_Test::TestBody()::Eq,std::allocator<std::unique_ptr<int,std::default_delete<int>>>,4ul,phmap::NullMutex>const,phmap::parallel_flat_hash_set<std::unique_ptr<int,std::default_delete<int>>,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_MergeExtractInsert_Test::TestBody()::Hash,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_MergeExtractInsert_Test::TestBody()::Eq,std::allocator<std::unique_ptr<int,std::default_delete<int>>>,4ul,phmap::NullMutex>const&>
               (parallel_flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_4UL,_phmap::NullMutex>
                *value,Matcher<const_phmap::parallel_flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_4UL,_phmap::NullMutex>_&>
                       *matcher,MatchResultListener *listener)

{
  bool bVar1;
  anon_union_8_1_a8a14541_for_iterator_1 ptr;
  bool bVar2;
  ostream *poVar3;
  type_info *type;
  long lVar4;
  const_iterator __begin0;
  StringMatchResultListener inner_listener;
  char local_218;
  undefined7 uStack_217;
  long local_210;
  long local_208 [2];
  const_iterator local_1f8;
  MatchResultListener local_1c8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  if (listener->stream_ == (ostream *)0x0) {
    local_1c8.stream_ = (ostream *)0x0;
    local_1c8._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_00275e38;
    bVar2 = MatcherBase<const_phmap::parallel_flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_4UL,_phmap::NullMutex>_&>
            ::MatchAndExplain(&matcher->
                               super_MatcherBase<const_phmap::parallel_flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_4UL,_phmap::NullMutex>_&>
                              ,value,&local_1c8);
    return bVar2;
  }
  local_1c8.stream_ = local_1a8;
  local_1c8._vptr_MatchResultListener = (_func_int **)&PTR__StringMatchResultListener_00275ed0;
  std::__cxx11::stringstream::stringstream(local_1b8);
  bVar2 = MatcherBase<const_phmap::parallel_flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_4UL,_phmap::NullMutex>_&>
          ::MatchAndExplain(&matcher->
                             super_MatcherBase<const_phmap::parallel_flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_4UL,_phmap::NullMutex>_&>
                            ,value,&local_1c8);
  poVar3 = listener->stream_;
  local_1f8.iter_.inner_._0_1_ = 0x7b;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_1f8,1);
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
  ::begin(&local_1f8,
          &value->
           super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
         );
  if (CONCAT71(local_1f8.iter_.inner_._1_7_,local_1f8.iter_.inner_._0_1_) != 0) {
    lVar4 = 0;
    do {
      ptr = local_1f8.iter_.it_.field_1;
      if (lVar4 == 0) {
LAB_001232fb:
        local_218 = ' ';
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_218,1);
        PrintSmartPointer<int,std::unique_ptr<int,std::default_delete<int>>,void>
                  (ptr.slot_,poVar3,0);
        lVar4 = lVar4 + 1;
        bVar1 = true;
      }
      else {
        local_218 = ',';
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_218,1);
        if (lVar4 != 0x20) goto LAB_001232fb;
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," ...",4);
        lVar4 = 0x20;
        bVar1 = false;
      }
    } while ((bVar1) &&
            (phmap::priv::
             parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
             ::const_iterator::operator++(&local_1f8),
            CONCAT71(local_1f8.iter_.inner_._1_7_,local_1f8.iter_.inner_._0_1_) != 0));
    if (lVar4 != 0) {
      local_1f8.iter_.inner_._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_1f8,1);
    }
  }
  local_1f8.iter_.inner_._0_1_ = 0x7d;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_1f8,1);
  GetTypeName_abi_cxx11_
            ((string *)&local_1f8,
             (internal *)
             &phmap::
              parallel_flat_hash_set<std::unique_ptr<int,std::default_delete<int>>,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_MergeExtractInsert_Test::TestBody()::Hash,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_MergeExtractInsert_Test::TestBody()::Eq,std::allocator<std::unique_ptr<int,std::default_delete<int>>>,4ul,phmap::NullMutex>
              ::typeinfo,type);
  if ((local_1f8.iter_.inner_end_ < (Inner *)0x15) ||
     (lVar4 = std::__cxx11::string::find_first_of((char *)&local_1f8,0x21027d,0), lVar4 == -1)) {
    poVar3 = listener->stream_;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," (of type ",10);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(char *)CONCAT71(local_1f8.iter_.inner_._1_7_,
                                                local_1f8.iter_.inner_._0_1_),
                        (long)local_1f8.iter_.inner_end_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
  }
  std::__cxx11::stringbuf::str();
  poVar3 = listener->stream_;
  if ((poVar3 != (ostream *)0x0) && (local_210 != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,(char *)CONCAT71(uStack_217,local_218),local_210);
  }
  if ((long *)CONCAT71(uStack_217,local_218) != local_208) {
    operator_delete((long *)CONCAT71(uStack_217,local_218),local_208[0] + 1);
  }
  if ((EmbeddedIterator *)CONCAT71(local_1f8.iter_.inner_._1_7_,local_1f8.iter_.inner_._0_1_) !=
      &local_1f8.iter_.it_) {
    operator_delete((undefined1 *)
                    CONCAT71(local_1f8.iter_.inner_._1_7_,local_1f8.iter_.inner_._0_1_),
                    (ulong)((long)local_1f8.iter_.it_.ctrl_ + 1));
  }
  local_1c8._vptr_MatchResultListener = (_func_int **)&PTR__StringMatchResultListener_00275ed0;
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return bVar2;
}

Assistant:

bool MatchPrintAndExplain(Value& value, const Matcher<T>& matcher,
                          MatchResultListener* listener) {
  if (!listener->IsInterested()) {
    // If the listener is not interested, we do not need to construct the
    // inner explanation.
    return matcher.Matches(value);
  }

  StringMatchResultListener inner_listener;
  const bool match = matcher.MatchAndExplain(value, &inner_listener);

  UniversalPrint(value, listener->stream());
#if GTEST_HAS_RTTI
  const std::string& type_name = GetTypeName<Value>();
  if (IsReadableTypeName(type_name))
    *listener->stream() << " (of type " << type_name << ")";
#endif
  PrintIfNotEmpty(inner_listener.str(), listener->stream());

  return match;
}